

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

void __thiscall
cmWhileFunctionBlocker::cmWhileFunctionBlocker
          (cmWhileFunctionBlocker *this,cmMakefile *mf,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  pointer pcVar1;
  
  cmFunctionBlocker::cmFunctionBlocker(&this->super_cmFunctionBlocker);
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmWhileFunctionBlocker_00856f88;
  this->Makefile = mf;
  pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::PushLoopBlock(this->Makefile);
  return;
}

Assistant:

cmWhileFunctionBlocker::cmWhileFunctionBlocker(
  cmMakefile* const mf, std::vector<cmListFileArgument> args)
  : Makefile{ mf }
  , Args{ std::move(args) }
{
  this->Makefile->PushLoopBlock();
}